

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteFlat<signed_char,signed_char,duckdb::UnaryOperatorWrapper,duckdb::BitCntOperator>
               (char *ldata,char *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  bool bVar1;
  char cVar2;
  idx_t iVar3;
  TemplatedValidityMask<unsigned_long> *pTVar4;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  idx_t i;
  byte in_stack_00000008;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff88;
  void *dataptr_00;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  unsigned_long local_58;
  idx_t in_stack_ffffffffffffffb0;
  ulong uVar5;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffc0;
  TemplatedValidityMask<unsigned_long> *mask_00;
  TemplatedValidityMask<unsigned_long> *pTVar6;
  TemplatedValidityMask<unsigned_long> *pTVar7;
  
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + (long)in_RDX),in_RSI,
             (void *)((long)in_RSI + (long)in_RDX),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/unary_executor.hpp"
             ,0x62);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_RCX);
  if (bVar1) {
    for (dataptr_00 = (void *)0x0; dataptr_00 < in_RDX; dataptr_00 = (void *)((long)dataptr_00 + 1))
    {
      cVar2 = UnaryOperatorWrapper::Operation<duckdb::BitCntOperator,signed_char,signed_char>
                        ((char)((ulong)in_stack_ffffffffffffffa0 >> 0x38),
                         (ValidityMask *)in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90,
                         dataptr_00);
      *(char *)((long)in_RSI + (long)dataptr_00) = cVar2;
    }
  }
  else {
    if ((in_stack_00000008 & 1) == 0) {
      TemplatedValidityMask<unsigned_long>::Initialize
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Copy
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    }
    mask_00 = (TemplatedValidityMask<unsigned_long> *)0x0;
    iVar3 = TemplatedValidityMask<unsigned_long>::EntryCount(0xdec950);
    for (uVar5 = 0; uVar5 < iVar3; uVar5 = uVar5 + 1) {
      local_58 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90);
      pTVar4 = (TemplatedValidityMask<unsigned_long> *)
               MinValue<unsigned_long>((unsigned_long)(mask_00 + 2),(unsigned_long)in_RDX);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_58);
      if (bVar1) {
        for (; pTVar7 = mask_00, mask_00 < pTVar4;
            mask_00 = (TemplatedValidityMask<unsigned_long> *)((long)&mask_00->validity_mask + 1)) {
          cVar2 = UnaryOperatorWrapper::Operation<duckdb::BitCntOperator,signed_char,signed_char>
                            ((char)((ulong)pTVar4 >> 0x38),(ValidityMask *)in_stack_ffffffffffffff98
                             ,(idx_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          *(char *)((long)in_RSI + (long)mask_00) = cVar2;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_58);
        pTVar6 = mask_00;
        pTVar7 = pTVar4;
        if (!bVar1) {
          for (; in_stack_ffffffffffffff98 = mask_00, pTVar7 = pTVar6, pTVar6 < pTVar4;
              pTVar6 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar6->validity_mask + 1)) {
            in_stack_ffffffffffffff90 =
                 (TemplatedValidityMask<unsigned_long> *)((long)pTVar6 - (long)mask_00);
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              (&local_58,(idx_t *)&stack0xffffffffffffff90);
            if (bVar1) {
              cVar2 = UnaryOperatorWrapper::
                      Operation<duckdb::BitCntOperator,signed_char,signed_char>
                                ((char)((ulong)pTVar4 >> 0x38),(ValidityMask *)mask_00,
                                 (idx_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
              *(char *)((long)in_RSI + (long)pTVar6) = cVar2;
            }
          }
        }
      }
      mask_00 = pTVar7;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}